

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O0

void __thiscall double_conversion::Bignum::AddBignum(Bignum *this,Bignum *other)

{
  uint uVar1;
  Chunk *pCVar2;
  int *piVar3;
  Bignum *in_RSI;
  Bignum *in_RDI;
  long in_FS_OFFSET;
  Chunk sum_1;
  Chunk my_1;
  Chunk sum;
  Chunk my;
  int i_1;
  int i;
  Chunk carry;
  int bigit_pos;
  Chunk local_60;
  Chunk local_54;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int local_34;
  int local_30;
  uint local_2c;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  Align((Bignum *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
        (Bignum *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  local_c = BigitLength(in_RDI);
  local_10 = BigitLength(in_RSI);
  std::max<int>(&local_c,&local_10);
  EnsureCapacity(0);
  local_2c = 0;
  local_14 = (int)in_RSI->exponent_ - (int)in_RDI->exponent_;
  for (local_30 = (int)in_RDI->used_bigits_; local_30 < local_14; local_30 = local_30 + 1) {
    pCVar2 = RawBigit(in_RDI,local_30);
    *pCVar2 = 0;
  }
  for (local_34 = 0; local_34 < in_RSI->used_bigits_; local_34 = local_34 + 1) {
    if (local_14 < in_RDI->used_bigits_) {
      pCVar2 = RawBigit(in_RDI,local_14);
      local_54 = *pCVar2;
    }
    else {
      local_54 = 0;
    }
    pCVar2 = RawBigit(in_RSI,local_34);
    local_2c = local_54 + *pCVar2 + local_2c;
    uVar1 = local_2c & 0xfffffff;
    pCVar2 = RawBigit(in_RDI,local_14);
    *pCVar2 = uVar1;
    local_2c = local_2c >> 0x1c;
    local_14 = local_14 + 1;
  }
  for (; local_2c != 0; local_2c = local_2c >> 0x1c) {
    if (local_14 < in_RDI->used_bigits_) {
      pCVar2 = RawBigit(in_RDI,local_14);
      local_60 = *pCVar2;
    }
    else {
      local_60 = 0;
    }
    local_2c = local_60 + local_2c;
    uVar1 = local_2c & 0xfffffff;
    pCVar2 = RawBigit(in_RDI,local_14);
    *pCVar2 = uVar1;
    local_14 = local_14 + 1;
  }
  local_18 = (int)in_RDI->used_bigits_;
  piVar3 = std::max<int>(&local_14,&local_18);
  in_RDI->used_bigits_ = (int16_t)*piVar3;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Bignum::AddBignum(const Bignum& other) {
  DOUBLE_CONVERSION_ASSERT(IsClamped());
  DOUBLE_CONVERSION_ASSERT(other.IsClamped());

  // If this has a greater exponent than other append zero-bigits to this.
  // After this call exponent_ <= other.exponent_.
  Align(other);

  // There are two possibilities:
  //   aaaaaaaaaaa 0000  (where the 0s represent a's exponent)
  //     bbbbb 00000000
  //   ----------------
  //   ccccccccccc 0000
  // or
  //    aaaaaaaaaa 0000
  //  bbbbbbbbb 0000000
  //  -----------------
  //  cccccccccccc 0000
  // In both cases we might need a carry bigit.

  EnsureCapacity(1 + (std::max)(BigitLength(), other.BigitLength()) - exponent_);
  Chunk carry = 0;
  int bigit_pos = other.exponent_ - exponent_;
  DOUBLE_CONVERSION_ASSERT(bigit_pos >= 0);
  for (int i = used_bigits_; i < bigit_pos; ++i) {
    RawBigit(i) = 0;
  }
  for (int i = 0; i < other.used_bigits_; ++i) {
    const Chunk my = (bigit_pos < used_bigits_) ? RawBigit(bigit_pos) : 0;
    const Chunk sum = my + other.RawBigit(i) + carry;
    RawBigit(bigit_pos) = sum & kBigitMask;
    carry = sum >> kBigitSize;
    ++bigit_pos;
  }
  while (carry != 0) {
    const Chunk my = (bigit_pos < used_bigits_) ? RawBigit(bigit_pos) : 0;
    const Chunk sum = my + carry;
    RawBigit(bigit_pos) = sum & kBigitMask;
    carry = sum >> kBigitSize;
    ++bigit_pos;
  }
  used_bigits_ = static_cast<int16_t>(std::max(bigit_pos, static_cast<int>(used_bigits_)));
  DOUBLE_CONVERSION_ASSERT(IsClamped());
}